

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O1

void GPU_InitMatrixStack(GPU_MatrixStack *stack)

{
  float **ppfVar1;
  float *pfVar2;
  
  if (stack != (GPU_MatrixStack *)0x0) {
    stack->storage_size = 1;
    stack->size = 1;
    ppfVar1 = (float **)SDL_malloc(8);
    stack->matrix = ppfVar1;
    pfVar2 = (float *)SDL_malloc(0x40);
    *stack->matrix = pfVar2;
    pfVar2 = *stack->matrix;
    pfVar2[0xc] = 0.0;
    pfVar2[0xd] = 0.0;
    pfVar2[0xe] = 0.0;
    pfVar2[0xf] = 0.0;
    pfVar2[8] = 0.0;
    pfVar2[9] = 0.0;
    pfVar2[10] = 0.0;
    pfVar2[0xb] = 0.0;
    pfVar2[4] = 0.0;
    pfVar2[5] = 0.0;
    pfVar2[6] = 0.0;
    pfVar2[7] = 0.0;
    pfVar2[0] = 0.0;
    pfVar2[1] = 0.0;
    pfVar2[2] = 0.0;
    pfVar2[3] = 0.0;
    pfVar2[0xf] = 1.0;
    pfVar2[10] = 1.0;
    pfVar2[5] = 1.0;
    *pfVar2 = 1.0;
  }
  return;
}

Assistant:

void GPU_InitMatrixStack(GPU_MatrixStack* stack)
{
    if(stack == NULL)
        return;
    
    stack->storage_size = 1;
    stack->size = 1;
    
    stack->matrix = (float**)SDL_malloc(sizeof(float*) * stack->storage_size);
    stack->matrix[0] = (float*)SDL_malloc(sizeof(float) * 16);
    GPU_MatrixIdentity(stack->matrix[0]);
}